

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

char * SimpleString::copyToNewBuffer(char *bufferToCopy,size_t bufferSize)

{
  int iVar1;
  char *result;
  TestMemoryAllocator *pTVar2;
  undefined4 extraout_var;
  size_t sVar4;
  char *pcVar3;
  
  pTVar2 = stringAllocator_;
  if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
    pTVar2 = defaultNewArrayAllocator();
  }
  iVar1 = (*pTVar2->_vptr_TestMemoryAllocator[2])
                    (pTVar2,bufferSize,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                     ,0x275);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
  if (((bufferSize != 0) && (pcVar3 != (char *)0x0)) && (*pcVar3 = *bufferToCopy, bufferSize != 1))
  {
    sVar4 = 1;
    do {
      if (pcVar3[sVar4 - 1] == '\0') break;
      pcVar3[sVar4] = bufferToCopy[sVar4];
      sVar4 = sVar4 + 1;
    } while (bufferSize != sVar4);
  }
  pcVar3[bufferSize - 1] = '\0';
  return pcVar3;
}

Assistant:

char* SimpleString::copyToNewBuffer(const char* bufferToCopy, size_t bufferSize)
{
    char* newBuffer = allocStringBuffer(bufferSize, __FILE__, __LINE__);
    StrNCpy(newBuffer, bufferToCopy, bufferSize);
    newBuffer[bufferSize-1] = '\0';
    return newBuffer;
}